

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformation_t *
opengv::relative_pose::optimize_nonlinear(RelativeAdapterBase *adapter,Indices *indices)

{
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  *in_RDI;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  *this;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *other;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  lm;
  NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>
  numDiff;
  OptimizeNonlinearFunctor1 functor;
  VectorXd x;
  int n;
  transformation_t *transformation;
  RelativeAdapterBase *in_stack_fffffffffffffbf8;
  Indices *in_stack_fffffffffffffc00;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  *this_00;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  *in_stack_fffffffffffffc30;
  NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>
  *in_stack_fffffffffffffc48;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  *in_stack_fffffffffffffc50;
  cayley_t *in_stack_fffffffffffffd28;
  rotation_t *in_stack_fffffffffffffd48;
  NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>
  local_150;
  Functor local_130 [11];
  undefined4 local_1c;
  
  local_1c = 6;
  this_00 = in_RDI;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_RDI,(int *)in_RDI);
  RelativeAdapterBase::gett12(in_stack_fffffffffffffbf8);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(Index)in_RDI,
             (Index)in_stack_fffffffffffffc00);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)in_stack_fffffffffffffc00
             ,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffbf8);
  RelativeAdapterBase::getR12(in_stack_fffffffffffffbf8);
  math::rot2cayley(in_stack_fffffffffffffd48);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(Index)in_RDI,
             (Index)in_stack_fffffffffffffc00);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)in_stack_fffffffffffffc00
             ,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffbf8);
  OptimizeNonlinearFunctor1::OptimizeNonlinearFunctor1
            ((OptimizeNonlinearFunctor1 *)this_00,(RelativeAdapterBase *)in_RDI,
             in_stack_fffffffffffffc00);
  Eigen::
  NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>::
  NumericalDiff(&local_150,local_130,0.0);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  ::LevenbergMarquardt(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  ::resetParameters(in_stack_fffffffffffffc30);
  this = (LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
          *)Eigen::GenericNumTraits<double>::epsilon();
  other = (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
          Eigen::GenericNumTraits<double>::epsilon();
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  ::minimize(in_RDI,(FVectorType *)this);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0xbb5698);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(Index)in_RDI,(Index)this
            );
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)this_00,(Index)in_RDI);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)this,other);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(Index)in_RDI,(Index)this
            );
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)other)
  ;
  math::cayley2rot(in_stack_fffffffffffffd28);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)this_00,(Index)in_RDI,(Index)this);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
  ::~LevenbergMarquardt(this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xbb5776);
  return (transformation_t *)this_00;
}

Assistant:

transformation_t optimize_nonlinear(
    RelativeAdapterBase & adapter,
    const Indices & indices )
{
  const int n=6;
  VectorXd x(n);

  x.block<3,1>(0,0) = adapter.gett12();
  x.block<3,1>(3,0) = math::rot2cayley(adapter.getR12());

  OptimizeNonlinearFunctor1 functor( adapter, indices );
  NumericalDiff<OptimizeNonlinearFunctor1> numDiff(functor);
  LevenbergMarquardt< NumericalDiff<OptimizeNonlinearFunctor1> >
      lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 1.E1*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E1*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 1000;
  lm.minimize(x);

  transformation_t transformation;
  transformation.col(3) = x.block<3,1>(0,0);
  transformation.block<3,3>(0,0) = math::cayley2rot(x.block<3,1>(3,0));
  return transformation;
}